

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O2

void __thiscall
nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
          (NeuralNetworkLayer *this,size_t inputCount,size_t outputCount,
          ActivationFunction *activationFunction)

{
  size_type __n;
  pointer pfVar1;
  pointer pvVar2;
  result_type __sd;
  float *value_1;
  pointer pfVar3;
  float *value;
  vector<float,_std::allocator<float>_> *values;
  pointer pvVar4;
  result_type_conflict1 rVar5;
  matrix_type *__range1_1;
  vector_type *__range1;
  mt19937 rng;
  allocator_type local_13d1;
  param_type local_13d0;
  matrix_type *local_13c8;
  vector_type *local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->m_inputCount = inputCount;
  this->m_outputCount = outputCount;
  (this->m_activationFunction).m_option = activationFunction->m_option;
  local_13c0 = &this->m_biases;
  std::vector<float,_std::allocator<float>_>::vector
            (local_13c0,outputCount,(allocator_type *)&local_13b8);
  __n = this->m_outputCount;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_13b8,this->m_inputCount,
             (allocator_type *)&local_13d0);
  local_13c8 = &this->m_weights;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(local_13c8,__n,(value_type *)&local_13b8,&local_13d1);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_13b8);
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,__sd);
  local_13d0._M_a = -1.0;
  local_13d0._M_b = 1.0;
  pfVar1 = (this->m_biases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar3 = (this->m_biases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13d0,&local_13b8);
    *pfVar3 = rVar5;
  }
  pvVar2 = (this->m_weights).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->m_weights).
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1) {
    pfVar1 = (pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pfVar3 = (pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
      rVar5 = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)&local_13d0,&local_13b8);
      *pfVar3 = rVar5;
    }
  }
  return;
}

Assistant:

NeuralNetworkLayer::NeuralNetworkLayer(std::size_t inputCount, std::size_t outputCount,
    const ActivationFunction& activationFunction)
    : m_inputCount(inputCount)
    , m_outputCount(outputCount)
    , m_activationFunction(activationFunction)
    , m_biases(m_outputCount)
    , m_weights(m_outputCount, vector_type(m_inputCount))
{
    std::mt19937 rng(std::time(NULL));
    std::uniform_real_distribution<float> uniform(-1.0f, 1.0f);

    for (auto& value : m_biases)
        value = uniform(rng);

    for (auto& values : m_weights)
        for (auto& value : values)
            value = uniform(rng);
}